

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<unsigned_int,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,uint input)

{
  hugeint_t *result_00;
  idx_t iVar1;
  string *msg;
  Vector *in_RSI;
  long in_RDI;
  hugeint_t *result;
  CastParameters parameters;
  uint8_t scale;
  uint8_t width;
  LogicalType *type;
  undefined8 in_stack_ffffffffffffff48;
  undefined2 uVar2;
  CastParameters *in_stack_ffffffffffffff50;
  allocator *this_00;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6b;
  undefined4 in_stack_ffffffffffffff6c;
  BaseAppender *in_stack_ffffffffffffff70;
  allocator local_81;
  string local_80 [32];
  hugeint_t *local_60;
  uint8_t local_22;
  uint8_t local_21;
  LogicalType *local_20;
  
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  if (*(char *)(in_RDI + 0x90) == '\0') {
    local_20 = Vector::GetType(in_RSI);
    local_21 = DecimalType::GetWidth((LogicalType *)in_stack_ffffffffffffff50);
    local_22 = DecimalType::GetScale((LogicalType *)in_stack_ffffffffffffff50);
    CastParameters::CastParameters(in_stack_ffffffffffffff50);
    result_00 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x944500);
    iVar1 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
    local_60 = result_00 + iVar1;
    TryCastToDecimal::Operation<unsigned_int,duckdb::hugeint_t>
              ((uint32_t)((ulong)in_RDI >> 0x20),result_00,in_stack_ffffffffffffff50,
               (uint8_t)((ushort)uVar2 >> 8),(uint8_t)uVar2);
  }
  else {
    if (*(char *)(in_RDI + 0x90) != '\x01') {
      msg = (string *)__cxa_allocate_exception(0x10);
      this_00 = &local_81;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"Type not implemented for AppenderType",this_00);
      InternalException::InternalException((InternalException *)this_00,msg);
      __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
    }
    AppendValueInternal<unsigned_int,duckdb::hugeint_t>
              (in_stack_ffffffffffffff70,
               (Vector *)
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT13(in_stack_ffffffffffffff6b,CONCAT12(1,in_stack_ffffffffffffff68))),
               (uint)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}